

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter.c
# Opt level: O0

_Bool isNonRestrictedXMLChar(uint c)

{
  bool local_6;
  _Bool local_5;
  uint c_local;
  
  local_5 = true;
  if (((((((c != 9) && (local_5 = true, c != 10)) && (local_5 = true, c != 0xd)) &&
        ((c < 0x20 || (local_5 = true, 0x7e < c)))) &&
       ((local_5 = true, c != 0x85 && ((c < 0xa0 || (local_5 = true, 0xd7ff < c)))))) &&
      ((((c < 0xe000 || (local_5 = true, 0xfdcf < c)) &&
        (((c < 0xfdf0 || (local_5 = true, 0xfffd < c)) &&
         ((c < 0x10000 || (local_5 = true, 0x1fffd < c)))))) &&
       (((c < 0x20000 || (local_5 = true, 0x2fffd < c)) &&
        ((c < 0x30000 || (local_5 = true, 0x3fffd < c)))))))) &&
     (((((((c < 0x40000 || (local_5 = true, 0x4fffd < c)) &&
          ((c < 0x50000 || (local_5 = true, 0x5fffd < c)))) &&
         ((c < 0x60000 || (local_5 = true, 0x6fffd < c)))) &&
        ((c < 0x70000 || (local_5 = true, 0x7fffd < c)))) &&
       ((((c < 0x80000 || (local_5 = true, 0x8fffd < c)) &&
         ((c < 0x90000 || (local_5 = true, 0x9fffd < c)))) &&
        ((c < 0xa0000 || (local_5 = true, 0xafffd < c)))))) &&
      (((c < 0xb0000 || (local_5 = true, 0xbfffd < c)) &&
       ((((c < 0xc0000 || (local_5 = true, 0xcfffd < c)) &&
         ((c < 0xd0000 || (local_5 = true, 0xdfffd < c)))) &&
        (((c < 0xe0000 || (local_5 = true, 0xefffd < c)) &&
         ((c < 0xf0000 || (local_5 = true, 0xffffd < c)))))))))))) {
    local_6 = 0xfffff < c && c < 0x10fffe;
    local_5 = local_6;
  }
  return local_5;
}

Assistant:

static bool isNonRestrictedXMLChar(unsigned int c) {
    return (c == 0x09u || c == 0x0Au || c == 0x0Du ||
            (c >= 0x20u && c <= 0x7Eu) || c == 0x85u ||
            (c >= 0xA0u && c <= 0xD7FFu) ||
            (c >= 0xE000u && c <= 0xFDCFu) ||
            (c >= 0xFDF0u && c <= 0xFFFDu) ||
            (c >= 0x10000u && c <= 0x1FFFDu) ||
            (c >= 0x20000u && c <= 0x2FFFDu) ||
            (c >= 0x30000u && c <= 0x3FFFDu) ||
            (c >= 0x40000u && c <= 0x4FFFDu) ||
            (c >= 0x50000u && c <= 0x5FFFDu) ||
            (c >= 0x60000u && c <= 0x6FFFDu) ||
            (c >= 0x70000u && c <= 0x7FFFDu) ||
            (c >= 0x80000u && c <= 0x8FFFDu) ||
            (c >= 0x90000u && c <= 0x9FFFDu) ||
            (c >= 0xA0000u && c <= 0xAFFFDu) ||
            (c >= 0xB0000u && c <= 0xBFFFDu) ||
            (c >= 0xC0000u && c <= 0xCFFFDu) ||
            (c >= 0xD0000u && c <= 0xDFFFDu) ||
            (c >= 0xE0000u && c <= 0xEFFFDu) ||
            (c >= 0xF0000u && c <= 0xFFFFDu) ||
            (c >= 0x100000u && c <= 0x10FFFD));
}